

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strict_fstream.hpp
# Opt level: O2

char * __thiscall strict_fstream::strerror_abi_cxx11_(strict_fstream *this,int __errnum)

{
  int *piVar1;
  char *__s;
  size_t sVar2;
  vector<char,_std::allocator<char>_> buff;
  allocator_type local_2a;
  value_type local_29;
  _Vector_base<char,_std::allocator<char>_> local_28;
  
  local_29 = '\0';
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_28,0x100,&local_29,&local_2a);
  piVar1 = __errno_location();
  __s = strerror_r(*piVar1,local_28._M_impl.super__Vector_impl_data._M_start,
                   (long)local_28._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_28._M_impl.super__Vector_impl_data._M_start);
  sVar2 = strlen(__s);
  *(strict_fstream **)this = this + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,__s,__s + sVar2);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_28);
  return (char *)this;
}

Assistant:

static std::string strerror()
{
    // Can't use std::string since we're pre-C++17
    std::vector<char> buff(256, '\0');

#ifdef _WIN32
    // Since strerror_s might set errno itself, we need to store it.
    const int err_num = errno;
    if (strerror_s(buff.data(), buff.size(), err_num) != 0) {
        return trim_to_null(buff);
    } else {
        return "Unknown error (" + std::to_string(err_num) + ")";
    }
#elif ((_POSIX_C_SOURCE >= 200112L || _XOPEN_SOURCE >= 600 || defined(__APPLE__) || defined(__FreeBSD__) || defined(__OpenBSD__)) && ! _GNU_SOURCE) || defined(__MUSL__)
// XSI-compliant strerror_r()
    const int err_num = errno; // See above
    if (strerror_r(err_num, buff.data(), buff.size()) == 0) {
        return trim_to_null(buff);
    } else {
        return "Unknown error (" + std::to_string(err_num) + ")";
    }
#else
// GNU-specific strerror_r()
    char * p = strerror_r(errno, &buff[0], buff.size());
    return std::string(p, std::strlen(p));
#endif
}